

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrdType * __thiscall Application::queryOrdType(OrdType *__return_storage_ptr__,Application *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 *puVar2;
  char value;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"1) Market",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"2) Limit",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"3) Stop",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"4) Stop Limit",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"OrdType: ",9);
  std::operator>>((istream *)&std::cin,&local_11);
  if ((byte)(local_11 - 0x31U) < 4) {
    FIX::CharField::CharField(&__return_storage_ptr__->super_CharField,0x28,local_11);
    (__return_storage_ptr__->super_CharField).super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_00161e30;
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = FIX::DoubleConvertor::fast_fixed_dtoa;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

FIX::OrdType Application::queryOrdType() {
  char value;
  std::cout << std::endl
            << "1) Market" << std::endl
            << "2) Limit" << std::endl
            << "3) Stop" << std::endl
            << "4) Stop Limit" << std::endl
            << "OrdType: ";

  std::cin >> value;
  switch (value) {
  case '1':
    return FIX::OrdType(FIX::OrdType_MARKET);
  case '2':
    return FIX::OrdType(FIX::OrdType_LIMIT);
  case '3':
    return FIX::OrdType(FIX::OrdType_STOP);
  case '4':
    return FIX::OrdType(FIX::OrdType_STOP_LIMIT);
  default:
    throw std::exception();
  }
}